

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shared.h
# Opt level: O0

SmartObject * __thiscall asl::SmartObject::operator=(SmartObject *this,SmartObject *n)

{
  SmartObject *n_local;
  SmartObject *this_local;
  
  unref(this);
  this->_p = n->_p;
  if (this->_p != (SmartObject_ *)0x0) {
    AtomicCount::operator++(&this->_p->rc);
  }
  return this;
}

Assistant:

SmartObject& operator=(const SmartObject& n)
	{
		unref();
		_p = n._p;
		if (_p)
			++_p->rc;
		return *this;
	}